

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::SetStartPoint(ON_PolylineCurve *this,ON_3dPoint start_point)

{
  ON_3dPoint *pOVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = ON_Curve::SetStartPoint(&this->super_ON_Curve,start_point);
  if (bVar2) {
    return true;
  }
  lVar3 = (long)(this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (lVar3 < 2) {
LAB_0059d418:
    bVar2 = false;
  }
  else {
    bVar2 = ON_3dPoint::IsValid((this->m_pline).super_ON_3dPointArray.
                                super_ON_SimpleArray<ON_3dPoint>.m_a);
    pOVar1 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    if (bVar2) {
      if ((pOVar1[lVar3 + -1].x == pOVar1->x) && (!NAN(pOVar1[lVar3 + -1].x) && !NAN(pOVar1->x))) {
        if ((pOVar1[lVar3 + -1].y == pOVar1->y) && (!NAN(pOVar1[lVar3 + -1].y) && !NAN(pOVar1->y)))
        {
          if ((pOVar1[lVar3 + -1].z == pOVar1->z) && (!NAN(pOVar1[lVar3 + -1].z) && !NAN(pOVar1->z))
             ) goto LAB_0059d418;
        }
      }
    }
    pOVar1->z = start_point.z;
    pOVar1->x = start_point.x;
    pOVar1->y = start_point.y;
    bVar2 = true;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return bVar2;
}

Assistant:

bool ON_PolylineCurve::SetStartPoint(
        ON_3dPoint start_point
        )
{
  // 10 March 2009 Dale Lear
  //    I'm using exact compare instead of the fuzzy IsClosed()
  //    check to permit setting the start point.  This fixes
  //    a bug Mikko reported that prevented making polylines
  //    exactly closed when the end points were almost exactly
  //    equal.  At this point, I don't remember why we don't allow
  //    SetStartPoint() the start point of a closed curve.
  if (ON_Curve::SetStartPoint(start_point))
    return true;
  bool rc = false;
  int count = m_pline.Count();
  if (    count >= 2 
    && ( !m_pline[0].IsValid()
         || m_pline[count-1].x != m_pline[0].x // used to call IsClosed()
         || m_pline[count-1].y != m_pline[0].y
         || m_pline[count-1].z != m_pline[0].z
       )
     )
  {
    m_pline[0] = start_point;
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}